

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O2

void __thiscall
vkt::QueryPool::anon_unknown_0::GeometryShaderTestInstance::createPipeline
          (GeometryShaderTestInstance *this)

{
  Move<vk::Handle<(vk::HandleType)16>_> *this_00;
  ProgramCollection<vk::ProgramBinary> *pPVar1;
  StencilOpState _front;
  StencilOpState _front_00;
  StencilOpState _back;
  StencilOpState _back_00;
  DeviceInterface *deviceInterface;
  VkDevice device;
  ProgramBinary *pPVar2;
  VkPhysicalDeviceFeatures *pVVar3;
  Move<vk::Handle<(vk::HandleType)18>_> *this_01;
  allocator_type local_5cd;
  value_type_conflict1 local_5cc;
  _Alloc_hider local_5c8;
  DeviceInterface *pDStack_5c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5b8 [2];
  undefined1 local_598 [64];
  RefBase<vk::Handle<(vk::HandleType)18>_> local_558;
  _Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_> local_538;
  _Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_> local_520;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_508;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_4e8;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_4c8;
  VkPipelineVertexInputStateCreateInfo vf_info;
  VkRect2D scissor;
  VkStencilOpState local_468;
  VkStencilOpState local_448;
  VkStencilOpState local_428;
  VkStencilOpState local_408;
  VkVertexInputBindingDescription vertexInputBindingDescription;
  PipelineLayoutCreateInfo pipelineLayoutCreateInfo;
  Attachment attachmentState;
  VkViewport viewport;
  PipelineCreateInfo pipelineCreateInfo;
  VkVertexInputAttributeDescription vertexInputAttributeDescriptions [2];
  
  deviceInterface =
       Context::getDeviceInterface
                 ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
                  super_TestInstance.m_context);
  device = Context::getDevice((this->super_GraphicBasicTestInstance).
                              super_StatisticQueryTestInstance.super_TestInstance.m_context);
  pPVar1 = ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
            super_TestInstance.m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5c8,"vertex",(allocator<char> *)&pipelineLayoutCreateInfo);
  pPVar2 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar1,(string *)&local_5c8);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&pipelineCreateInfo,deviceInterface,device,
             pPVar2,0);
  local_4c8.m_data.deleter.m_device =
       (VkDevice)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_;
  local_4c8.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
  local_4c8.m_data.object.m_internal = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
  local_4c8.m_data.deleter.m_deviceIface =
       (DeviceInterface *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_ = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext = (void *)0x0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages =
       (VkPipelineShaderStageCreateInfo *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&pipelineCreateInfo);
  std::__cxx11::string::~string((string *)&local_5c8);
  pPVar1 = ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
            super_TestInstance.m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5c8,"geometry",(allocator<char> *)&pipelineLayoutCreateInfo);
  pPVar2 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar1,(string *)&local_5c8);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&pipelineCreateInfo,deviceInterface,device,
             pPVar2,0);
  local_4e8.m_data.deleter.m_device =
       (VkDevice)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_;
  local_4e8.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
  local_4e8.m_data.object.m_internal = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
  local_4e8.m_data.deleter.m_deviceIface =
       (DeviceInterface *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_ = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext = (void *)0x0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages =
       (VkPipelineShaderStageCreateInfo *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&pipelineCreateInfo);
  std::__cxx11::string::~string((string *)&local_5c8);
  pPVar1 = ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
            super_TestInstance.m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5c8,"fragment",(allocator<char> *)&pipelineLayoutCreateInfo);
  pPVar2 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar1,(string *)&local_5c8);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&pipelineCreateInfo,deviceInterface,device,
             pPVar2,0);
  local_508.m_data.deleter.m_device =
       (VkDevice)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_;
  local_508.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
  local_508.m_data.object.m_internal = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
  local_508.m_data.deleter.m_deviceIface =
       (DeviceInterface *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_ = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext = (void *)0x0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages =
       (VkPipelineShaderStageCreateInfo *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&pipelineCreateInfo);
  std::__cxx11::string::~string((string *)&local_5c8);
  Draw::PipelineCreateInfo::ColorBlendState::Attachment::Attachment
            (&attachmentState,0,VK_BLEND_FACTOR_SRC_COLOR,VK_BLEND_FACTOR_DST_COLOR,VK_BLEND_OP_ADD,
             VK_BLEND_FACTOR_SRC_COLOR,VK_BLEND_FACTOR_DST_COLOR,VK_BLEND_OP_ADD,0xf);
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_ = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext = (void *)0x0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags = 0;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount = 0;
  Draw::PipelineLayoutCreateInfo::PipelineLayoutCreateInfo
            (&pipelineLayoutCreateInfo,
             (vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
              *)&pipelineCreateInfo,0,(VkPushConstantRange *)0x0);
  std::
  _Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>::
  ~_Vector_base((_Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                 *)&pipelineCreateInfo);
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&local_5c8,deviceInterface,device,
             &pipelineLayoutCreateInfo.super_VkPipelineLayoutCreateInfo,(VkAllocationCallbacks *)0x0
            );
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags = local_5b8[0]._0_4_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount = local_5b8[0]._4_4_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages =
       (VkPipelineShaderStageCreateInfo *)local_5b8[0]._8_8_;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_ = local_5c8._M_p;
  pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext = pDStack_5c0;
  local_5c8._M_p = (pointer)0x0;
  pDStack_5c0 = (DeviceInterface *)0x0;
  local_5b8[0]._M_allocated_capacity = 0;
  local_5b8[0]._8_8_ = 0;
  this_00 = &(this->super_GraphicBasicTestInstance).m_pipelineLayout;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::reset
            (&this_00->super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  (this->super_GraphicBasicTestInstance).m_pipelineLayout.
  super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device =
       (VkDevice)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_;
  (this->super_GraphicBasicTestInstance).m_pipelineLayout.
  super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
  (this_00->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal =
       pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
  (this->super_GraphicBasicTestInstance).m_pipelineLayout.
  super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&local_5c8);
  vf_info.pVertexBindingDescriptions = &vertexInputBindingDescription;
  vertexInputBindingDescription.binding = 0;
  vertexInputBindingDescription.stride = 0x20;
  vertexInputBindingDescription.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  vf_info.pVertexAttributeDescriptions = vertexInputAttributeDescriptions;
  vertexInputAttributeDescriptions[1].location = 1;
  vertexInputAttributeDescriptions[1].binding = 0;
  vertexInputAttributeDescriptions[1].format = VK_FORMAT_R32G32B32A32_SFLOAT;
  vertexInputAttributeDescriptions[1].offset = 0x10;
  vf_info.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  vf_info.pNext = (void *)0x0;
  vertexInputAttributeDescriptions[0].location = 0;
  vertexInputAttributeDescriptions[0].binding = 0;
  vertexInputAttributeDescriptions[0].format = VK_FORMAT_R32G32B32A32_SFLOAT;
  vertexInputAttributeDescriptions[0].offset = 0;
  vf_info.flags = 0;
  vf_info.vertexBindingDescriptionCount = 1;
  vf_info.vertexAttributeDescriptionCount = 2;
  Draw::PipelineCreateInfo::PipelineCreateInfo
            (&pipelineCreateInfo,
             (VkPipelineLayout)
             (this->super_GraphicBasicTestInstance).m_pipelineLayout.
             super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal,
             (VkRenderPass)
             (this->super_GraphicBasicTestInstance).m_renderPass.
             super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal,0,0);
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)&local_5c8,(VkShaderModule)local_4c8.m_data.object.m_internal,
             "main",VK_SHADER_STAGE_VERTEX_BIT);
  Draw::PipelineCreateInfo::addShader
            (&pipelineCreateInfo,(VkPipelineShaderStageCreateInfo *)&local_5c8);
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)&local_5c8,(VkShaderModule)local_4e8.m_data.object.m_internal,
             "main",VK_SHADER_STAGE_GEOMETRY_BIT);
  Draw::PipelineCreateInfo::addShader
            (&pipelineCreateInfo,(VkPipelineShaderStageCreateInfo *)&local_5c8);
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)&local_5c8,(VkShaderModule)local_508.m_data.object.m_internal,
             "main",VK_SHADER_STAGE_FRAGMENT_BIT);
  Draw::PipelineCreateInfo::addShader
            (&pipelineCreateInfo,(VkPipelineShaderStageCreateInfo *)&local_5c8);
  Draw::PipelineCreateInfo::InputAssemblerState::InputAssemblerState
            ((InputAssemblerState *)&local_5c8,
             ((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology,0);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineInputAssemblyStateCreateInfo *)&local_5c8);
  Draw::PipelineCreateInfo::ColorBlendState::ColorBlendState
            ((ColorBlendState *)&local_5c8,1,
             &attachmentState.super_VkPipelineColorBlendAttachmentState,0,VK_LOGIC_OP_COPY);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineColorBlendStateCreateInfo *)&local_5c8);
  std::
  _Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
  ::~_Vector_base((_Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
                   *)(local_598 + 8));
  viewport.x = 0.0;
  viewport.y = 0.0;
  viewport.width = 64.0;
  viewport.height = 64.0;
  viewport.minDepth = 0.0;
  viewport.maxDepth = 1.0;
  scissor.offset.x = 0;
  scissor.offset.y = 0;
  scissor.extent.width = 0x40;
  scissor.extent.height = 0x40;
  std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::vector
            ((vector<vk::VkViewport,_std::allocator<vk::VkViewport>_> *)&local_520,1,&viewport,
             (allocator_type *)&local_558);
  std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::vector
            ((vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_> *)&local_538,1,&scissor,
             (allocator_type *)&local_5cc);
  Draw::PipelineCreateInfo::ViewportState::ViewportState
            ((ViewportState *)&local_5c8,1,
             (vector<vk::VkViewport,_std::allocator<vk::VkViewport>_> *)&local_520,
             (vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_> *)&local_538);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineViewportStateCreateInfo *)&local_5c8);
  Draw::PipelineCreateInfo::ViewportState::~ViewportState((ViewportState *)&local_5c8);
  std::_Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::~_Vector_base(&local_538);
  std::_Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>::~_Vector_base(&local_520);
  pVVar3 = Context::getDeviceFeatures
                     ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
                      super_TestInstance.m_context);
  if (pVVar3->depthBounds == 0) {
    Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
              ((StencilOpState *)&local_448,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
               VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
    Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
              ((StencilOpState *)&local_468,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
               VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
    _front_00.super_VkStencilOpState.depthFailOp = local_448.depthFailOp;
    _front_00.super_VkStencilOpState.failOp = local_448.failOp;
    _front_00.super_VkStencilOpState.passOp = local_448.passOp;
    _front_00.super_VkStencilOpState.compareOp = local_448.compareOp;
    _front_00.super_VkStencilOpState.compareMask = local_448.compareMask;
    _front_00.super_VkStencilOpState.writeMask = local_448.writeMask;
    _front_00.super_VkStencilOpState.reference = local_448.reference;
    _back_00.super_VkStencilOpState.depthFailOp = local_468.depthFailOp;
    _back_00.super_VkStencilOpState.failOp = local_468.failOp;
    _back_00.super_VkStencilOpState.passOp = local_468.passOp;
    _back_00.super_VkStencilOpState.compareOp = local_468.compareOp;
    _back_00.super_VkStencilOpState.compareMask = local_468.compareMask;
    _back_00.super_VkStencilOpState.writeMask = local_468.writeMask;
    _back_00.super_VkStencilOpState.reference = local_468.reference;
    Draw::PipelineCreateInfo::DepthStencilState::DepthStencilState
              ((DepthStencilState *)&local_5c8,0,0,VK_COMPARE_OP_ALWAYS,0,0,_front_00,_back_00,0.0,
               1.0);
    Draw::PipelineCreateInfo::addState
              (&pipelineCreateInfo,(VkPipelineDepthStencilStateCreateInfo *)&local_5c8);
  }
  else {
    Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
              ((StencilOpState *)&local_408,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
               VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
    Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
              ((StencilOpState *)&local_428,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
               VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
    _front.super_VkStencilOpState.depthFailOp = local_408.depthFailOp;
    _front.super_VkStencilOpState.failOp = local_408.failOp;
    _front.super_VkStencilOpState.passOp = local_408.passOp;
    _front.super_VkStencilOpState.compareOp = local_408.compareOp;
    _front.super_VkStencilOpState.compareMask = local_408.compareMask;
    _front.super_VkStencilOpState.writeMask = local_408.writeMask;
    _front.super_VkStencilOpState.reference = local_408.reference;
    _back.super_VkStencilOpState.depthFailOp = local_428.depthFailOp;
    _back.super_VkStencilOpState.failOp = local_428.failOp;
    _back.super_VkStencilOpState.passOp = local_428.passOp;
    _back.super_VkStencilOpState.compareOp = local_428.compareOp;
    _back.super_VkStencilOpState.compareMask = local_428.compareMask;
    _back.super_VkStencilOpState.writeMask = local_428.writeMask;
    _back.super_VkStencilOpState.reference = local_428.reference;
    Draw::PipelineCreateInfo::DepthStencilState::DepthStencilState
              ((DepthStencilState *)&local_5c8,1,1,VK_COMPARE_OP_GREATER_OR_EQUAL,1,0,_front,_back,
               0.0,1.0);
    Draw::PipelineCreateInfo::addState
              (&pipelineCreateInfo,(VkPipelineDepthStencilStateCreateInfo *)&local_5c8);
  }
  Draw::PipelineCreateInfo::RasterizerState::RasterizerState
            ((RasterizerState *)&local_5c8,0,0,VK_POLYGON_MODE_FILL,0,VK_FRONT_FACE_CLOCKWISE,1,0.0,
             0.0,0.0,1.0);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineRasterizationStateCreateInfo *)&local_5c8);
  local_5cc = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_558,1,&local_5cc,
             &local_5cd);
  Draw::PipelineCreateInfo::MultiSampleState::MultiSampleState
            ((MultiSampleState *)&local_5c8,VK_SAMPLE_COUNT_1_BIT,0,0.0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_558,false,false);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineMultisampleStateCreateInfo *)&local_5c8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_598);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_558);
  Draw::PipelineCreateInfo::addState(&pipelineCreateInfo,&vf_info);
  ::vk::createGraphicsPipeline
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&local_558,deviceInterface,device,
             (VkPipelineCache)0x0,&pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo,
             (VkAllocationCallbacks *)0x0);
  local_5b8[0]._M_allocated_capacity = local_558.m_data.deleter.m_device;
  local_5b8[0]._8_8_ = local_558.m_data.deleter.m_allocator;
  local_5c8._M_p = (pointer)local_558.m_data.object.m_internal;
  pDStack_5c0 = local_558.m_data.deleter.m_deviceIface;
  local_558.m_data.object.m_internal = 0;
  local_558.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_558.m_data.deleter.m_device = (VkDevice)0x0;
  local_558.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  this_01 = &(this->super_GraphicBasicTestInstance).m_pipeline;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::reset
            (&this_01->super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  (this->super_GraphicBasicTestInstance).m_pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.
  m_data.deleter.m_device = (VkDevice)local_5b8[0]._0_8_;
  (this->super_GraphicBasicTestInstance).m_pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.
  m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_5b8[0]._8_8_;
  (this_01->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal =
       (deUint64)local_5c8._M_p;
  (this->super_GraphicBasicTestInstance).m_pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.
  m_data.deleter.m_deviceIface = pDStack_5c0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_558);
  Draw::PipelineCreateInfo::~PipelineCreateInfo(&pipelineCreateInfo);
  Draw::PipelineLayoutCreateInfo::~PipelineLayoutCreateInfo(&pipelineLayoutCreateInfo);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_508);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_4e8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_4c8);
  return;
}

Assistant:

void GeometryShaderTestInstance::createPipeline (void)
{
	const DeviceInterface&	vk		= m_context.getDeviceInterface();
	const VkDevice			device	= m_context.getDevice();

	// Pipeline
	Unique<VkShaderModule> vs(createShaderModule(vk, device, m_context.getBinaryCollection().get("vertex"), (VkShaderModuleCreateFlags)0));
	Unique<VkShaderModule> gs(createShaderModule(vk, device, m_context.getBinaryCollection().get("geometry"), (VkShaderModuleCreateFlags)0));
	Unique<VkShaderModule> fs(createShaderModule(vk, device, m_context.getBinaryCollection().get("fragment"), (VkShaderModuleCreateFlags)0));

	const PipelineCreateInfo::ColorBlendState::Attachment attachmentState;

	const PipelineLayoutCreateInfo pipelineLayoutCreateInfo;
	m_pipelineLayout = createPipelineLayout(vk, device, &pipelineLayoutCreateInfo);

	const VkVertexInputBindingDescription vertexInputBindingDescription		=
	{
		0u,											// binding;
		static_cast<deUint32>(sizeof(VertexData)),	// stride;
		VK_VERTEX_INPUT_RATE_VERTEX					// inputRate
	};

	const VkVertexInputAttributeDescription vertexInputAttributeDescriptions[] =
	{
		{
			0u,
			0u,
			VK_FORMAT_R32G32B32A32_SFLOAT,
			0u
		},	// VertexElementData::position
		{
			1u,
			0u,
			VK_FORMAT_R32G32B32A32_SFLOAT,
			static_cast<deUint32>(sizeof(tcu::Vec4))
		},	// VertexElementData::color
	};

	const VkPipelineVertexInputStateCreateInfo vf_info			=
	{																	// sType;
		VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,		// pNext;
		NULL,															// flags;
		0u,																// vertexBindingDescriptionCount;
		1,																// pVertexBindingDescriptions;
		&vertexInputBindingDescription,									// vertexAttributeDescriptionCount;
		2,																// pVertexAttributeDescriptions;
		vertexInputAttributeDescriptions
	};

	PipelineCreateInfo pipelineCreateInfo(*m_pipelineLayout, *m_renderPass, 0, (VkPipelineCreateFlags)0);
	pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*vs, "main", VK_SHADER_STAGE_VERTEX_BIT));
	pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*gs, "main", VK_SHADER_STAGE_GEOMETRY_BIT));
	pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*fs, "main", VK_SHADER_STAGE_FRAGMENT_BIT));
	pipelineCreateInfo.addState(PipelineCreateInfo::InputAssemblerState(m_parametersGraphic.primitiveTopology));
	pipelineCreateInfo.addState(PipelineCreateInfo::ColorBlendState(1, &attachmentState));

	const VkViewport	viewport	=
	{
		0.0f,		// float x;
		0.0f,		// float y;
		WIDTH,	// float width;
		HEIGHT,	// float height;
		0.0f,	// float minDepth;
		1.0f	// float maxDepth;
	};

	const VkRect2D		scissor		=
	{
		{
			0,		// deInt32 x
			0,		// deInt32 y
		},		// VkOffset2D	offset;
		{
			WIDTH,	// deInt32 width;
			HEIGHT,	// deInt32 height
		},		// VkExtent2D	extent;
	};
	pipelineCreateInfo.addState(PipelineCreateInfo::ViewportState(1, std::vector<VkViewport>(1, viewport), std::vector<VkRect2D>(1, scissor)));

	if (m_context.getDeviceFeatures().depthBounds)
		pipelineCreateInfo.addState(PipelineCreateInfo::DepthStencilState(true, true, VK_COMPARE_OP_GREATER_OR_EQUAL, true));
	else
		pipelineCreateInfo.addState(PipelineCreateInfo::DepthStencilState());

	pipelineCreateInfo.addState(PipelineCreateInfo::RasterizerState(false));
	pipelineCreateInfo.addState(PipelineCreateInfo::MultiSampleState());
	pipelineCreateInfo.addState(vf_info);
	m_pipeline = createGraphicsPipeline(vk, device, DE_NULL, &pipelineCreateInfo);
}